

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_and_relation.cpp
# Opt level: O0

int formore(void)

{
  ostream *poVar1;
  void *this;
  int local_90;
  int local_8c;
  int i_1;
  int i;
  longlong factorials [16];
  
  _i_1 = 1;
  factorials[0] = 1;
  for (local_8c = 2; local_8c < 0x10; local_8c = local_8c + 1) {
    *(long *)(&i_1 + (long)local_8c * 2) =
         (long)local_8c * *(long *)(&i_1 + (long)(local_8c + -1) * 2);
  }
  for (local_90 = 0; local_90 < 0x10; local_90 = local_90 + 1) {
    poVar1 = (ostream *)std::ostream::operator<<(&std::cout,local_90);
    poVar1 = std::operator<<(poVar1,"! = ");
    this = (void *)std::ostream::operator<<(poVar1,*(longlong *)(&i_1 + (long)local_90 * 2));
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int formore () {
    long long factorials[ArSize];
    factorials[1] = factorials[0] = 1LL;

    for (int i = 2; i < ArSize; i++) {
        factorials[i] = i * factorials[i - 1];
    }

    for (int i = 0; i < ArSize; i++) {
        std::cout << i << "! = " << factorials[i] << std::endl;
    }

    return 0;
}